

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void __thiscall
DScroller::DScroller
          (DScroller *this,double dx,double dy,line_t_conflict *l,int control,int accel,
          EScrollPos scrollpos)

{
  undefined8 uVar1;
  line_t_conflict *plVar2;
  EScrollPos EVar3;
  DInterpolation *pDVar4;
  sector_t *psVar5;
  double dVar6;
  double dVar7;
  DScroller *local_c8;
  undefined1 local_c0 [24];
  double local_a8;
  undefined1 local_a0 [24];
  double local_88;
  sector_t *local_80;
  double d;
  side_t *local_70;
  sector_t *local_68;
  double y;
  undefined1 local_50 [24];
  double x;
  uint32_t local_30;
  EScrollPos scrollpos_local;
  int accel_local;
  int control_local;
  line_t_conflict *l_local;
  double dy_local;
  double dx_local;
  DScroller *this_local;
  
  x._4_4_ = scrollpos;
  local_30 = accel;
  scrollpos_local = control;
  _accel_local = (sector_t *)l;
  l_local = (line_t_conflict *)dy;
  dy_local = dx;
  dx_local = (double)this;
  DThinker::DThinker(&this->super_DThinker,0x20);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_009faa10;
  local_c8 = (DScroller *)this->m_Interpolations;
  do {
    TObjPtr<DInterpolation>::TObjPtr((TObjPtr<DInterpolation> *)local_c8);
    local_c8 = (DScroller *)
               ((anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 *)&local_c8->super_DThinker +
               1);
  } while (local_c8 != this + 1);
  line_t::Delta((line_t *)local_50);
  local_50._16_8_ = local_50._0_8_ & 0x7fffffffffffffff;
  line_t::Delta((line_t *)&d);
  psVar5 = (sector_t *)ABS((double)local_70);
  local_68 = psVar5;
  if ((double)local_50._16_8_ < (double)psVar5) {
    local_80 = (sector_t *)local_50._16_8_;
    local_68 = (sector_t *)local_50._16_8_;
    local_50._16_8_ = psVar5;
  }
  uVar1 = local_50._16_8_;
  dVar6 = c_atan2((double)local_68,(double)local_50._16_8_);
  dVar6 = fastsin(dVar6 + 1.5707963267948966);
  plVar2 = l_local;
  local_80 = (sector_t *)((double)uVar1 / dVar6);
  line_t::Delta((line_t *)(local_a0 + 0x10));
  dVar6 = dy_local;
  line_t::Delta((line_t *)local_a0);
  dVar7 = dy_local;
  local_50._16_8_ = -((double)plVar2 * local_88 + dVar6 * (double)local_a0._0_8_) / (double)local_80
  ;
  line_t::Delta((line_t *)(local_c0 + 0x10));
  plVar2 = l_local;
  line_t::Delta((line_t *)local_c0);
  local_68 = (sector_t *)
             (-(dVar7 * local_a8 - (double)plVar2 * (double)local_c0._0_8_) / (double)local_80);
  this->m_Type = sc_side;
  this->m_dx = (double)local_50._16_8_;
  this->m_dy = (double)local_68;
  this->m_vdy = 0.0;
  this->m_vdx = 0.0;
  this->m_Accel = local_30;
  this->m_Parts = x._4_4_;
  this->m_LastHeight = 0.0;
  this->m_Control = scrollpos_local;
  if (scrollpos_local != 0xffffffff) {
    dVar6 = sector_t::CenterFloor((sector_t *)(sectors + (int)scrollpos_local));
    dVar7 = sector_t::CenterCeiling((sector_t *)(sectors + (int)scrollpos_local));
    this->m_LastHeight = dVar6 + dVar7;
  }
  this->m_Affectee =
       (int)(((long)*(side_t **)&_accel_local->planes[0].Texture - (long)sides) / 0xc0);
  sides[this->m_Affectee].Flags = sides[this->m_Affectee].Flags | 2;
  pDVar4 = TObjPtr<DInterpolation>::operator=(this->m_Interpolations + 2,(DInterpolation *)0x0);
  pDVar4 = TObjPtr<DInterpolation>::operator=(this->m_Interpolations + 1,pDVar4);
  TObjPtr<DInterpolation>::operator=(this->m_Interpolations,pDVar4);
  EVar3 = ::operator&(this->m_Parts,scw_top);
  if (EVar3 != 0) {
    pDVar4 = side_t::SetInterpolation(sides + this->m_Affectee,0);
    TObjPtr<DInterpolation>::operator=(this->m_Interpolations,pDVar4);
  }
  EVar3 = ::operator&(this->m_Parts,scw_mid);
  if ((EVar3 != 0) &&
     (((sides[this->m_Affectee].linedef)->backsector == (sector_t_conflict *)0x0 ||
      (((sides[this->m_Affectee].linedef)->flags & 0x200000) == 0)))) {
    pDVar4 = side_t::SetInterpolation(sides + this->m_Affectee,1);
    TObjPtr<DInterpolation>::operator=(this->m_Interpolations + 1,pDVar4);
  }
  EVar3 = ::operator&(this->m_Parts,scw_bottom);
  if (EVar3 != 0) {
    pDVar4 = side_t::SetInterpolation(sides + this->m_Affectee,2);
    TObjPtr<DInterpolation>::operator=(this->m_Interpolations + 2,pDVar4);
  }
  return;
}

Assistant:

DScroller::DScroller (double dx, double dy, const line_t *l,
					 int control, int accel, EScrollPos scrollpos)
	: DThinker (STAT_SCROLLER)
{
	double x = fabs(l->Delta().X), y = fabs(l->Delta().Y), d;
	if (y > x) d = x, x = y, y = d;

	d = x / g_sin(g_atan2(y, x) + M_PI / 2);
	x = -(dy * l->Delta().Y + dx * l->Delta().X) / d;
	y = -(dx * l->Delta().Y - dy * l->Delta().X) / d;

	m_Type = EScroll::sc_side;
	m_dx = x;
	m_dy = y;
	m_vdx = m_vdy = 0;
	m_Accel = accel;
	m_Parts = scrollpos;
	m_LastHeight = 0;
	if ((m_Control = control) != -1)
		m_LastHeight = sectors[control].CenterFloor() + sectors[control].CenterCeiling();
	m_Affectee = int(l->sidedef[0] - sides);
	sides[m_Affectee].Flags |= WALLF_NOAUTODECALS;
	m_Interpolations[0] = m_Interpolations[1] = m_Interpolations[2] = NULL;

	if (m_Parts & EScrollPos::scw_top)
	{
		m_Interpolations[0] = sides[m_Affectee].SetInterpolation(side_t::top);
	}
	if (m_Parts & EScrollPos::scw_mid && (sides[m_Affectee].linedef->backsector == NULL ||
		!(sides[m_Affectee].linedef->flags&ML_3DMIDTEX)))
	{
		m_Interpolations[1] = sides[m_Affectee].SetInterpolation(side_t::mid);
	}
	if (m_Parts & EScrollPos::scw_bottom)
	{
		m_Interpolations[2] = sides[m_Affectee].SetInterpolation(side_t::bottom);
	}
}